

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.hpp
# Opt level: O2

void __thiscall
Args::Command::Command<char_const(&)[4]>
          (Command *this,char (*nm) [4],ValueOptions opt,bool isSubCommandRequired)

{
  int iVar1;
  bool bVar2;
  BaseException *pBVar3;
  allocator local_d1;
  String local_d0;
  String local_b0;
  String local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  GroupIface::GroupIface<char_const(&)[4]>(&this->super_GroupIface,nm,false);
  (this->super_GroupIface).super_ArgIface._vptr_ArgIface = (_func_int **)&PTR__Command_00131cd8;
  *(ValueOptions *)&(this->super_GroupIface).field_0x4c = opt;
  (this->m_valueSpecifier)._M_dataplus._M_p = (pointer)&(this->m_valueSpecifier).field_2;
  (this->m_valueSpecifier)._M_string_length = 0;
  (this->m_valueSpecifier).field_2._M_local_buf[0] = '\0';
  (this->m_description)._M_dataplus._M_p = (pointer)&(this->m_description).field_2;
  (this->m_description)._M_string_length = 0;
  (this->m_description).field_2._M_local_buf[0] = '\0';
  (this->m_longDescription)._M_dataplus._M_p = (pointer)&(this->m_longDescription).field_2;
  (this->m_longDescription)._M_string_length = 0;
  (this->m_longDescription).field_2._M_local_buf[0] = '\0';
  this->m_isDefined = false;
  this->m_isSubCommandRequired = isSubCommandRequired;
  (this->m_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_values).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_defaultValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_defaultValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_defaultValues).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_subCommand = (Command *)0x0;
  std::__cxx11::string::string((string *)&local_d0,(string *)&(this->super_GroupIface).m_name);
  bVar2 = details::isArgument(&local_d0);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_b0,this);
    bVar2 = details::isFlag(&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (!bVar2) {
      (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_d0,this);
      std::__cxx11::string::~string((string *)&local_d0);
      if (local_d0._M_string_length != 0) {
        iVar1 = *(int *)&(this->super_GroupIface).field_0x4c;
        if ((iVar1 == 2) || (iVar1 == 1)) {
          std::__cxx11::string::assign((char *)&this->m_valueSpecifier);
        }
        return;
      }
      pBVar3 = (BaseException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&local_90,"Command can\'t be with empty name.",(allocator *)&local_d0);
      BaseException::BaseException(pBVar3,&local_90);
      __cxa_throw(pBVar3,&BaseException::typeinfo,BaseException::~BaseException);
    }
  }
  pBVar3 = (BaseException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_b0,
             "Command\'s name can\'t start with \"-\" whereas you are trying to set name to \"",
             &local_d1);
  (*(this->super_GroupIface).super_ArgIface._vptr_ArgIface[3])(&local_70,this);
  std::operator+(&local_d0,&local_b0,&local_70);
  std::operator+(&local_50,&local_d0,"\".");
  BaseException::BaseException(pBVar3,&local_50);
  __cxa_throw(pBVar3,&BaseException::typeinfo,BaseException::~BaseException);
}

Assistant:

explicit Command( T && nm,
		ValueOptions opt = ValueOptions::NoValue,
		bool isSubCommandRequired = false )
		:	GroupIface( std::forward< T > ( nm ) )
		,	m_opt( opt )
		,	m_isDefined( false )
		,	m_isSubCommandRequired( isSubCommandRequired )
		,	m_subCommand( nullptr )
	{
		if( details::isArgument( name() ) || details::isFlag( name() ) )
			throw BaseException( String( SL( "Command's name can't "
				"start with \"-\" whereas you are trying to set name to \"" ) ) +
				name() + SL( "\"." ) );

		if( name().empty() )
			throw BaseException(
				String( SL( "Command can't be with empty name." ) ) );

		switch( m_opt )
		{
			case ValueOptions::OneValue :
			{
				m_valueSpecifier = SL( "arg" );
			}
				break;

			case ValueOptions::ManyValues :
			{
				m_valueSpecifier = SL( "args" );
			}
				break;

			default :
				break;
		}
	}